

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Gia_Man_t * Gia_ManDupMuxesTest(Gia_Man_t *p)

{
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  Gia_Man_t *pNew2;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManDupMuxes(p,2);
  p_01 = Gia_ManDupNoMuxes(p_00,0);
  Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  Gia_ManPrintStats(p_01,(Gps_Par_t *)0x0);
  Gia_ManStop(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupMuxesTest( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pNew2;
    pNew = Gia_ManDupMuxes( p, 2 );
    pNew2 = Gia_ManDupNoMuxes( pNew, 0 );
    Gia_ManPrintStats( p, NULL );
    Gia_ManPrintStats( pNew, NULL );
    Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew );
//    Gia_ManStop( pNew2 );
    return pNew2;
}